

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::MakeDirectory(char *path,mode_t *mode)

{
  allocator<char> local_41;
  string local_40;
  mode_t *local_20;
  mode_t *mode_local;
  char *path_local;
  
  if (path == (char *)0x0) {
    path_local._7_1_ = 0;
  }
  else {
    local_20 = mode;
    mode_local = (mode_t *)path;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_41);
    path_local._7_1_ = MakeDirectory(&local_40,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool SystemTools::MakeDirectory(const char* path, const mode_t* mode)
{
  if (!path) {
    return false;
  }
  return SystemTools::MakeDirectory(std::string(path), mode);
}